

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# up_xtreme.c
# Opt level: O0

mraa_board_t * mraa_upxtreme_board(void)

{
  int iVar1;
  int iVar2;
  mraa_result_t mVar3;
  mraa_board_t *board;
  mraa_pininfo_t *pmVar4;
  mraa_adv_func_t *pmVar5;
  char *pcVar6;
  int have_pinctrl;
  char *pinctrl_path;
  int i_1;
  int i;
  int i2c_bus_num;
  mraa_pincapabilities_t local_b4;
  mraa_pincapabilities_t local_b0;
  mraa_pincapabilities_t local_ac;
  mraa_pincapabilities_t local_a8;
  mraa_pincapabilities_t local_a4;
  mraa_pincapabilities_t local_a0;
  mraa_pincapabilities_t local_9c;
  mraa_pincapabilities_t local_98;
  mraa_pincapabilities_t local_94;
  mraa_pincapabilities_t local_90;
  mraa_pincapabilities_t local_8c;
  mraa_pincapabilities_t local_88;
  mraa_pincapabilities_t local_84;
  mraa_pincapabilities_t local_80;
  mraa_pincapabilities_t local_7c;
  mraa_pincapabilities_t local_78;
  mraa_pincapabilities_t local_74;
  mraa_pincapabilities_t local_70;
  mraa_pincapabilities_t local_6c;
  mraa_pincapabilities_t local_68;
  mraa_pincapabilities_t local_64;
  mraa_pincapabilities_t local_60;
  mraa_pincapabilities_t local_5c;
  mraa_pincapabilities_t local_58;
  mraa_pincapabilities_t local_54;
  mraa_pincapabilities_t local_50;
  mraa_pincapabilities_t local_4c;
  mraa_pincapabilities_t local_48;
  mraa_pincapabilities_t local_44;
  mraa_pincapabilities_t local_40;
  mraa_pincapabilities_t local_3c;
  mraa_pincapabilities_t local_38;
  mraa_pincapabilities_t local_34;
  mraa_pincapabilities_t local_30;
  mraa_pincapabilities_t local_2c;
  mraa_pincapabilities_t local_28;
  mraa_pincapabilities_t local_24;
  mraa_pincapabilities_t local_20;
  mraa_pincapabilities_t local_1c;
  mraa_board_t *b;
  
  board = (mraa_board_t *)calloc(1,0x5f0);
  if (board != (mraa_board_t *)0x0) {
    board->platform_name = "UPXTREME";
    board->platform_version = "1.0.0";
    board->phy_pin_count = 0x29;
    board->gpio_count = 0x1c;
    board->chardev_capable = 0;
    pmVar4 = (mraa_pininfo_t *)malloc(0x7914);
    board->pins = pmVar4;
    if (board->pins != (mraa_pininfo_t *)0x0) {
      pmVar5 = (mraa_adv_func_t *)calloc(1,0x288);
      board->adv_func = pmVar5;
      if (board->adv_func == (mraa_adv_func_t *)0x0) {
        free(board->pins);
      }
      else {
        board->adv_func->aio_get_valid_fp = mraa_up_aio_get_valid_fp;
        local_1c = (mraa_pincapabilities_t)((uint)local_1c & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,0,"INVALID",local_1c,-1,-1,-1);
        local_20 = (mraa_pincapabilities_t)((uint)local_20 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,1,"3.3v",local_20,-1,-1,-1);
        local_24 = (mraa_pincapabilities_t)((uint)local_24 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,2,"5v",local_24,-1,-1,-1);
        local_28 = (mraa_pincapabilities_t)(CONCAT31(local_28._1_3_,3) | 0x20);
        mraa_upxtreme_set_pininfo(board,3,"I2C_SDA",local_28,0x170,0,0xa8);
        local_2c = (mraa_pincapabilities_t)((uint)local_2c & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,4,"5v",local_2c,-1,-1,-1);
        local_30 = (mraa_pincapabilities_t)(CONCAT31(local_30._1_3_,3) | 0x20);
        mraa_upxtreme_set_pininfo(board,5,"I2C_SCL",local_30,0x171,0,0xa9);
        local_34 = (mraa_pincapabilities_t)((uint)local_34 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,6,"GND",local_34,-1,-1,-1);
        local_38 = (mraa_pincapabilities_t)(CONCAT31(local_38._1_3_,3) | 0x40);
        mraa_upxtreme_set_pininfo(board,7,"ADC0",local_38,0x128,0,0x60);
        local_3c = (mraa_pincapabilities_t)(CONCAT31(local_3c._1_3_,3) | 0x80);
        mraa_upxtreme_set_pininfo(board,8,"UART_TX",local_3c,0x1d5,0,0x10d);
        local_40 = (mraa_pincapabilities_t)((uint)local_40 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,9,"GND",local_40,-1,-1,-1);
        local_44 = (mraa_pincapabilities_t)(CONCAT31(local_44._1_3_,3) | 0x80);
        mraa_upxtreme_set_pininfo(board,10,"UART_RX",local_44,0x1d4,0,0x10c);
        local_48 = (mraa_pincapabilities_t)(CONCAT31(local_48._1_3_,3) | 0x80);
        mraa_upxtreme_set_pininfo(board,0xb,"UART_RTS",local_48,0x1d6,0,0x10e);
        local_4c._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0xc,"I2S_CLK",local_4c,0x168,0,0xa0);
        local_50._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0xd,"GPIO27",local_50,0x10c,0,0x44);
        local_54 = (mraa_pincapabilities_t)((uint)local_54 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,0xe,"GND",local_54,-1,-1,-1);
        local_58._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0xf,"GPIO22",local_58,0x10e,0,0x46);
        local_5c._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x10,"GPIO23",local_5c,0x108,0,0x40);
        local_60 = (mraa_pincapabilities_t)((uint)local_60 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,0x11,"3.3v",local_60,-1,-1,-1);
        local_64._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x12,"GPIO24",local_64,0x109,0,0x41);
        local_68 = (mraa_pincapabilities_t)(CONCAT31(local_68._1_3_,3) | 0x10);
        mraa_upxtreme_set_pininfo(board,0x13,"SPI0_MOSI",local_68,0x134,0,0x6c);
        local_6c = (mraa_pincapabilities_t)((uint)local_6c & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,0x14,"GND",local_6c,-1,-1,-1);
        local_70 = (mraa_pincapabilities_t)(CONCAT31(local_70._1_3_,3) | 0x10);
        mraa_upxtreme_set_pininfo(board,0x15,"SPI0_MISO",local_70,0x133,0,0x6b);
        local_74._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x16,"GPIO25",local_74,0x10a,0,0x42);
        local_78 = (mraa_pincapabilities_t)(CONCAT31(local_78._1_3_,3) | 0x10);
        mraa_upxtreme_set_pininfo(board,0x17,"SPI0_CLK",local_78,0x132,0,0x6a);
        local_7c = (mraa_pincapabilities_t)(CONCAT31(local_7c._1_3_,3) | 0x10);
        mraa_upxtreme_set_pininfo(board,0x18,"SPI0_CS0",local_7c,0x131,0,0x69);
        local_80 = (mraa_pincapabilities_t)((uint)local_80 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,0x19,"GND",local_80,-1,-1,-1);
        local_84 = (mraa_pincapabilities_t)(CONCAT31(local_84._1_3_,3) | 0x10);
        mraa_upxtreme_set_pininfo(board,0x1a,"SPI0_CS1",local_84,0x137,0,0x6f);
        local_88 = (mraa_pincapabilities_t)(CONCAT31(local_88._1_3_,3) | 0x20);
        mraa_upxtreme_set_pininfo(board,0x1b,"ID_SD",local_88,0x16e,0,0xa6);
        local_8c = (mraa_pincapabilities_t)(CONCAT31(local_8c._1_3_,3) | 0x20);
        mraa_upxtreme_set_pininfo(board,0x1c,"ID_SC",local_8c,0x16f,0,0xa7);
        local_90._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x1d,"GPIO5",local_90,0x13d,0,0x75);
        local_94 = (mraa_pincapabilities_t)((uint)local_94 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,0x1e,"GND",local_94,-1,-1,-1);
        local_98._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x1f,"GPIO6",local_98,0x13e,0,0x76);
        local_9c._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x20,"GPIO12",local_9c,0x12a,0,0x62);
        local_a0._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x21,"GPIO13",local_a0,299,0,99);
        local_a4 = (mraa_pincapabilities_t)((uint)local_a4 & 0xffffff00);
        mraa_upxtreme_set_pininfo(board,0x22,"GND",local_a4,-1,-1,-1);
        local_a8._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x23,"I2S_FRM",local_a8,0x169,0,0xa1);
        local_ac = (mraa_pincapabilities_t)(CONCAT31(local_ac._1_3_,3) | 0x80);
        mraa_upxtreme_set_pininfo(board,0x24,"UART_CTS",local_ac,0x1d7,0,0x10f);
        local_b0._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x25,"GPIO26",local_b0,0x10b,0,0x43);
        local_b4._0_1_ = 3;
        mraa_upxtreme_set_pininfo(board,0x26,"I2S_DIN",local_b4,0x16b,0,0xa3);
        i2c_bus_num = i2c_bus_num & 0xffffff00;
        mraa_upxtreme_set_pininfo(board,0x27,"GND",(mraa_pincapabilities_t)i2c_bus_num,-1,-1,-1);
        i = CONCAT31(i._1_3_,3);
        mraa_upxtreme_set_pininfo(board,0x28,"I2S_DOUT",(mraa_pincapabilities_t)i,0x16a,0,0xa2);
        board->i2c_bus_count = 0;
        board->def_i2c_bus = 0;
        iVar2 = mraa_find_i2c_bus_pci("0000:00","0000:00:19.0","i2c_designware.3");
        if (iVar2 == -1) {
          syslog(4,"UP Xtreme: Platform failed to find I2C0 controller");
        }
        else {
          iVar1 = board->i2c_bus_count;
          board->i2c_bus[iVar1].bus_id = iVar2;
          mraa_upxtreme_get_pin_index(board,"I2C_SDA",&board->i2c_bus[iVar1].sda);
          mraa_upxtreme_get_pin_index(board,"I2C_SCL",&board->i2c_bus[iVar1].scl);
          board->i2c_bus_count = board->i2c_bus_count + 1;
        }
        iVar2 = mraa_find_i2c_bus_pci("0000:00","0000:00:15.3","i2c_designware.2");
        if (iVar2 == -1) {
          syslog(4,"UP Xtreme: Platform failed to find I2C1 controller");
        }
        else {
          iVar1 = board->i2c_bus_count;
          board->i2c_bus[iVar1].bus_id = iVar2;
          mraa_upxtreme_get_pin_index(board,"ID_SD",&board->i2c_bus[iVar1].sda);
          mraa_upxtreme_get_pin_index(board,"ID_SC",&board->i2c_bus[iVar1].scl);
          board->i2c_bus_count = board->i2c_bus_count + 1;
        }
        board->pwm_dev_count = 0;
        board->spi_bus_count = 0;
        board->def_spi_bus = 0;
        board->spi_bus[0].bus_id = 0;
        board->spi_bus[0].slave_s = 0;
        mraa_upxtreme_get_pin_index(board,"SPI0_CS0",&board->spi_bus[0].cs);
        mraa_upxtreme_get_pin_index(board,"SPI0_MOSI",&board->spi_bus[0].mosi);
        mraa_upxtreme_get_pin_index(board,"SPI0_MISO",&board->spi_bus[0].miso);
        mraa_upxtreme_get_pin_index(board,"SPI0_CLK",&board->spi_bus[0].sclk);
        board->spi_bus_count = board->spi_bus_count + 1;
        board->spi_bus[1].bus_id = 0;
        board->spi_bus[1].slave_s = 1;
        mraa_upxtreme_get_pin_index(board,"SPI0_CS1",&board->spi_bus[1].cs);
        mraa_upxtreme_get_pin_index(board,"SPI0_MOSI",&board->spi_bus[1].mosi);
        mraa_upxtreme_get_pin_index(board,"SPI0_MISO",&board->spi_bus[1].miso);
        mraa_upxtreme_get_pin_index(board,"SPI0_CLK",&board->spi_bus[1].sclk);
        board->spi_bus_count = board->spi_bus_count + 1;
        board->uart_dev_count = 0;
        board->def_uart_dev = 0;
        mVar3 = mraa_find_uart_bus_pci
                          ("/sys/bus/pci/devices/0000:00:1e.1/dw-apb-uart.6/tty/",
                           &board->uart_dev[0].device_path);
        if (mVar3 == MRAA_SUCCESS) {
          mraa_upxtreme_get_pin_index(board,"UART_RX",&board->uart_dev[0].rx);
          mraa_upxtreme_get_pin_index(board,"UART_TX",&board->uart_dev[0].tx);
          mraa_upxtreme_get_pin_index(board,"UART_CTS",&board->uart_dev[0].cts);
          mraa_upxtreme_get_pin_index(board,"UART_RTS",&board->uart_dev[0].rts);
          board->uart_dev_count = board->uart_dev_count + 1;
        }
        else {
          syslog(4,"UP Xtreme: Platform failed to find uart controller");
        }
        board->aio_count = 1;
        board->adc_raw = 8;
        board->adc_supported = 8;
        board->aio_non_seq = 1;
        mraa_upxtreme_get_pin_index(board,"ADC0",(int *)board->aio_dev);
        iVar2 = access("/sys/bus/platform/drivers/upboard-pinctrl",0);
        pcVar6 = "un";
        if (iVar2 != -1) {
          pcVar6 = "";
        }
        syslog(5,"UP Xtreme: kernel pinctrl driver %savailable",pcVar6);
        if (iVar2 != -1) {
          return board;
        }
      }
    }
    syslog(2,"UP Xtreme: Platform failed to initialise");
    free(board);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_upxtreme_board()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof (mraa_board_t));

    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->platform_version = PLATFORM_VERSION;
    b->phy_pin_count = MRAA_UPXTREME_PINCOUNT;
    b->gpio_count = MRAA_UPXTREME_GPIOCOUNT;
    b->chardev_capable = 0;

    b->pins = (mraa_pininfo_t*) malloc(sizeof(mraa_pininfo_t) * MRAA_UPXTREME_PINCOUNT);
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t *) calloc(1, sizeof (mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    b->adv_func->aio_get_valid_fp = &mraa_up_aio_get_valid_fp;

    mraa_upxtreme_set_pininfo(b, 0, "INVALID",    (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 1, "3.3v",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 2, "5v",         (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 3, "I2C_SDA",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 168, 0, 168);
    mraa_upxtreme_set_pininfo(b, 4, "5v",         (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 5, "I2C_SCL",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 169, 0, 169);
    mraa_upxtreme_set_pininfo(b, 6, "GND",        (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 7, "ADC0",       (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 1, 0}, MRAA_UPXTREME_CHIP_BASE + 96, 0, 96);
    mraa_upxtreme_set_pininfo(b, 8, "UART_TX",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 269, 0, 269);
    mraa_upxtreme_set_pininfo(b, 9, "GND",        (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 10, "UART_RX",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 268, 0, 268);
    mraa_upxtreme_set_pininfo(b, 11, "UART_RTS",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 270, 0, 270);
    mraa_upxtreme_set_pininfo(b, 12, "I2S_CLK",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 160, 0, 160);
    mraa_upxtreme_set_pininfo(b, 13, "GPIO27",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 68, 0, 68);
    mraa_upxtreme_set_pininfo(b, 14, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 15, "GPIO22",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 70, 0, 70);
    mraa_upxtreme_set_pininfo(b, 16, "GPIO23",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 64, 0, 64);
    mraa_upxtreme_set_pininfo(b, 17, "3.3v",      (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 18, "GPIO24",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 65, 0, 65);
    mraa_upxtreme_set_pininfo(b, 19, "SPI0_MOSI", (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 108, 0, 108);
    mraa_upxtreme_set_pininfo(b, 20, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 21, "SPI0_MISO", (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 107, 0, 107);
    mraa_upxtreme_set_pininfo(b, 22, "GPIO25",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 66, 0, 66);
    mraa_upxtreme_set_pininfo(b, 23, "SPI0_CLK",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 106, 0, 106);
    mraa_upxtreme_set_pininfo(b, 24, "SPI0_CS0",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 105, 0, 105);
    mraa_upxtreme_set_pininfo(b, 25, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 26, "SPI0_CS1",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 111, 0, 111);
    mraa_upxtreme_set_pininfo(b, 27, "ID_SD",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 166, 0, 166);
    mraa_upxtreme_set_pininfo(b, 28, "ID_SC",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 167, 0, 167);
    mraa_upxtreme_set_pininfo(b, 29, "GPIO5",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 117, 0, 117);
    mraa_upxtreme_set_pininfo(b, 30, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 31, "GPIO6",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 118, 0, 118);
    mraa_upxtreme_set_pininfo(b, 32, "GPIO12",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 98, 0, 98);
    mraa_upxtreme_set_pininfo(b, 33, "GPIO13",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 99, 0, 99);
    mraa_upxtreme_set_pininfo(b, 34, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 35, "I2S_FRM",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 161, 0, 161);
    mraa_upxtreme_set_pininfo(b, 36, "UART_CTS",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 271, 0, 271);
    mraa_upxtreme_set_pininfo(b, 37, "GPIO26",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 67, 0, 67);
    mraa_upxtreme_set_pininfo(b, 38, "I2S_DIN",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 163, 0, 163);
    mraa_upxtreme_set_pininfo(b, 39, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 40, "I2S_DOUT",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 162, 0, 162);

    b->i2c_bus_count = 0;
    b->def_i2c_bus = 0;
    int i2c_bus_num;

    // Configure I2C adaptor #0 (default)
    // (For consistency with Raspberry Pi 2, use I2C1 as our primary I2C bus)
    i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:19.0", "i2c_designware.3");
    if (i2c_bus_num != -1) {
        int i = b->i2c_bus_count;
        b->i2c_bus[i].bus_id = i2c_bus_num;
        mraa_upxtreme_get_pin_index(b, "I2C_SDA", &(b->i2c_bus[i].sda));
        mraa_upxtreme_get_pin_index(b, "I2C_SCL", &(b->i2c_bus[i].scl));
        b->i2c_bus_count++;
    } else {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find I2C0 controller");
    }

    // Configure I2C adaptor #1
    // (normally reserved for accessing HAT EEPROM)
    i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:15.3", "i2c_designware.2");
    if (i2c_bus_num != -1) {
        int i = b->i2c_bus_count;
        b->i2c_bus[i].bus_id = i2c_bus_num;
        mraa_upxtreme_get_pin_index(b, "ID_SD", &(b->i2c_bus[i].sda));
        mraa_upxtreme_get_pin_index(b, "ID_SC", &(b->i2c_bus[i].scl));
        b->i2c_bus_count++;
    } else {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find I2C1 controller");
    }

    // Configure PWM
    b->pwm_dev_count = 0;

    // Configure SPI
    b->spi_bus_count = 0;
    b->def_spi_bus = 0;

    // Configure SPI #0 CS0 (default)
    b->spi_bus[0].bus_id = 0;
    b->spi_bus[0].slave_s = 0;
    mraa_upxtreme_get_pin_index(b, "SPI0_CS0",  &(b->spi_bus[0].cs));
    mraa_upxtreme_get_pin_index(b, "SPI0_MOSI", &(b->spi_bus[0].mosi));
    mraa_upxtreme_get_pin_index(b, "SPI0_MISO", &(b->spi_bus[0].miso));
    mraa_upxtreme_get_pin_index(b, "SPI0_CLK",  &(b->spi_bus[0].sclk));
    b->spi_bus_count++;

    // Configure SPI #0 CS1
    b->spi_bus[1].bus_id = 0;
    b->spi_bus[1].slave_s = 1;
    mraa_upxtreme_get_pin_index(b, "SPI0_CS1",  &(b->spi_bus[1].cs));
    mraa_upxtreme_get_pin_index(b, "SPI0_MOSI", &(b->spi_bus[1].mosi));
    mraa_upxtreme_get_pin_index(b, "SPI0_MISO", &(b->spi_bus[1].miso));
    mraa_upxtreme_get_pin_index(b, "SPI0_CLK",  &(b->spi_bus[1].sclk));
    b->spi_bus_count++;

    // Configure UART
    b->uart_dev_count = 0;
    b->def_uart_dev = 0;
    // setting up a default path
    if (mraa_find_uart_bus_pci("/sys/bus/pci/devices/0000:00:1e.1/dw-apb-uart.6/tty/",
                               &(b->uart_dev[0].device_path)) != MRAA_SUCCESS) {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find uart controller");
    } else {
        // Configure UART #1 (default)
        mraa_upxtreme_get_pin_index(b, "UART_RX", &(b->uart_dev[0].rx));
        mraa_upxtreme_get_pin_index(b, "UART_TX", &(b->uart_dev[0].tx));
        mraa_upxtreme_get_pin_index(b, "UART_CTS", &(b->uart_dev[0].cts));
        mraa_upxtreme_get_pin_index(b, "UART_RTS", &(b->uart_dev[0].rts));
        b->uart_dev_count++;
    }

    // Configure ADC #0
    b->aio_count = 1;
    b->adc_raw = 8;
    b->adc_supported = 8;
    b->aio_non_seq = 1;
    mraa_upxtreme_get_pin_index(b, "ADC0", (int*) &(b->aio_dev[0].pin));

    const char* pinctrl_path = "/sys/bus/platform/drivers/upboard-pinctrl";
    int have_pinctrl = access(pinctrl_path, F_OK) != -1;
    syslog(LOG_NOTICE, "UP Xtreme: kernel pinctrl driver %savailable", have_pinctrl ? "" : "un");

    if (have_pinctrl)
        return b;

error:
    syslog(LOG_CRIT, "UP Xtreme: Platform failed to initialise");
    free(b);
    return NULL;
}